

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlv.cpp
# Opt level: O1

Error * ot::commissioner::tlv::GetTlvListByType
                  (Error *__return_storage_ptr__,TlvList *aTlvList,ByteArray *aBuf,Type aTlvType,
                  Scope aScope)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  Tlv *__args;
  list<ot::commissioner::tlv::Tlv,std::allocator<ot::commissioner::tlv::Tlv>> *plVar3;
  char *pcVar4;
  bool bVar5;
  _Node *p_Var6;
  ByteArray *extraout_RDX;
  ByteArray *extraout_RDX_00;
  ByteArray *extraout_RDX_01;
  ByteArray *aBytes;
  int iVar7;
  char *from;
  type atVar8 [2];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  char *to;
  string_view fmt;
  format_args args;
  size_t offset;
  TlvPtr tlvPtr;
  writer write;
  size_t local_e8;
  Tlv *local_e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d8;
  list<ot::commissioner::tlv::Tlv,std::allocator<ot::commissioner::tlv::Tlv>> *local_d0;
  string local_c8;
  undefined1 local_a8 [32];
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
  local_88;
  string local_50;
  
  __return_storage_ptr__->mCode = kNone;
  paVar1 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)paVar1;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_e8 = 0;
  std::__cxx11::_List_base<ot::commissioner::tlv::Tlv,_std::allocator<ot::commissioner::tlv::Tlv>_>
  ::_M_clear(&aTlvList->
              super__List_base<ot::commissioner::tlv::Tlv,_std::allocator<ot::commissioner::tlv::Tlv>_>
            );
  (aTlvList->
  super__List_base<ot::commissioner::tlv::Tlv,_std::allocator<ot::commissioner::tlv::Tlv>_>)._M_impl
  ._M_node.super__List_node_base._M_prev = (_List_node_base *)aTlvList;
  (aTlvList->
  super__List_base<ot::commissioner::tlv::Tlv,_std::allocator<ot::commissioner::tlv::Tlv>_>)._M_impl
  ._M_node.super__List_node_base._M_next = (_List_node_base *)aTlvList;
  (aTlvList->
  super__List_base<ot::commissioner::tlv::Tlv,_std::allocator<ot::commissioner::tlv::Tlv>_>)._M_impl
  ._M_node._M_size = 0;
  local_d0 = (list<ot::commissioner::tlv::Tlv,std::allocator<ot::commissioner::tlv::Tlv>> *)aTlvList
  ;
  do {
    if ((ulong)((long)(aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start) <= local_e8) {
      return __return_storage_ptr__;
    }
    Tlv::Deserialize((Tlv *)&local_e0,__return_storage_ptr__,&local_e8,aBuf,aScope);
    __args = local_e0;
    iVar7 = 6;
    if (__return_storage_ptr__->mCode == kNone) {
      if (local_e0 == (Tlv *)0x0) {
        abort();
      }
      bVar5 = Tlv::IsValid(local_e0);
      plVar3 = local_d0;
      if ((bVar5) && (__args->mType == aTlvType)) {
        p_Var6 = std::__cxx11::
                 list<ot::commissioner::tlv::Tlv,std::allocator<ot::commissioner::tlv::Tlv>>::
                 _M_create_node<ot::commissioner::tlv::Tlv_const&>(local_d0,__args);
        std::__detail::_List_node_base::_M_hook(&p_Var6->super__List_node_base);
        *(long *)(plVar3 + 0x10) = *(long *)(plVar3 + 0x10) + 1;
      }
      else {
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"coap","");
        local_88.types_[0] = uint_type;
        local_88.types_[1] = string_type;
        from = "dropping invalid/unknown TLV(type={}, value={})";
        local_88.context_.super_basic_format_parse_context<char>.format_str_.data_ =
             "dropping invalid/unknown TLV(type={}, value={})";
        local_88.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x2f;
        local_88.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
        local_88.context_.super_basic_format_parse_context<char>._20_4_ = 2;
        local_88.parse_funcs_[0] =
             ::fmt::v10::detail::
             parse_format_specs<unsigned_char,fmt::v10::detail::compile_parse_context<char>>;
        local_88.parse_funcs_[1] =
             ::fmt::v10::detail::
             parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
        aBytes = extraout_RDX;
        local_a8._0_8_ = &local_88;
        local_88.context_.types_ = local_88.types_;
        do {
          if (from == "") break;
          to = from;
          if (*from == '{') {
LAB_001ed686:
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::writer::operator()((writer *)local_a8,from,to);
            from = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_char,std::__cxx11::string>&>
                             (to,"",&local_88);
            bVar5 = true;
            aBytes = extraout_RDX_00;
          }
          else {
            to = from + 1;
            bVar5 = to != "";
            if (bVar5) {
              if (*to != '{') {
                pcVar4 = from + 2;
                do {
                  to = pcVar4;
                  bVar5 = to != "";
                  if (to == "") goto LAB_001ed682;
                  pcVar4 = to + 1;
                } while (*to != '{');
              }
              bVar5 = true;
            }
LAB_001ed682:
            if (bVar5) goto LAB_001ed686;
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::writer::operator()((writer *)local_a8,from,"");
            bVar5 = false;
            aBytes = extraout_RDX_01;
          }
        } while (bVar5);
        atVar8._1_7_ = 0;
        atVar8[0]._0_1_ = local_e0->mType;
        utils::Hex_abi_cxx11_((string *)local_a8,(utils *)&local_e0->mValue,aBytes);
        local_88.context_.super_basic_format_parse_context<char>.format_str_.size_ = local_a8._0_8_;
        local_88.context_.super_basic_format_parse_context<char>._16_8_ = local_a8._8_8_;
        fmt.size_ = 0xd2;
        fmt.data_ = (char *)0x2f;
        args.field_1.args_ = in_R9.args_;
        args.desc_ = (unsigned_long_long)&local_88;
        local_88.types_ = atVar8;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_50,(v10 *)"dropping invalid/unknown TLV(type={}, value={})",fmt,args);
        Log(kWarn,&local_c8,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if ((format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
             *)local_a8._0_8_ !=
            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
             *)(local_a8 + 0x10)) {
          operator_delete((void *)local_a8._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p);
        }
      }
      iVar7 = 0;
    }
    if (local_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8);
    }
    if (iVar7 != 0) {
      if ((iVar7 != 6) &&
         (pcVar2 = (__return_storage_ptr__->mMessage)._M_dataplus._M_p,
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)pcVar2 != paVar1)) {
        operator_delete(pcVar2);
      }
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

Error GetTlvListByType(TlvList &aTlvList, const ByteArray &aBuf, tlv::Type aTlvType, Scope aScope)
{
    Error  error;
    size_t offset = 0;

    aTlvList.clear();

    while (offset < aBuf.size())
    {
        auto tlvPtr = tlv::Tlv::Deserialize(error, offset, aBuf, aScope);
        SuccessOrExit(error);
        VerifyOrDie(tlvPtr != nullptr);

        if (tlvPtr->IsValid() && tlvPtr->GetType() == aTlvType)
        {
            aTlvList.push_back(*tlvPtr);
        }
        else
        {
            // Drop invalid TLVs
            LOG_WARN(LOG_REGION_COAP, "dropping invalid/unknown TLV(type={}, value={})",
                     utils::to_underlying(tlvPtr->GetType()), utils::Hex(tlvPtr->GetValue()));
        }
    }

exit:
    return error;
}